

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double birthday_pdf(int n)

{
  int iVar1;
  double dVar2;
  
  dVar2 = 0.0;
  if (0xfffffe92 < n - 0x16eU) {
    dVar2 = 1.0;
    for (iVar1 = 0x16d; n + iVar1 != 0x16e; iVar1 = iVar1 + -1) {
      dVar2 = (dVar2 * (double)iVar1) / 365.0;
    }
    dVar2 = (dVar2 * (double)(n + -1)) / 365.0;
  }
  return dVar2;
}

Assistant:

double birthday_pdf ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    BIRTHDAY_PDF returns the Birthday Concurrence PDF.
//
//  Discussion:
//
//    The probability is the probability that the N-th person is the
//    first one to match a birthday with someone earlier.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    26 August 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int N, the number of people whose birthdays have been
//    disclosed.
//
//    Output, double BIRTHDAY_PDF, the probability that the N-th person
//    is the first to match a birthday with someone earlier.
//
{
  int i;
  double pdf;

  if ( n < 1 || 365 < n )
  {
    pdf = 0.0;
    return pdf;
  }
  pdf = 1.0;
//
//  Compute the probability that N-1 people have distinct birthdays.
//
  for ( i = 1; i <= n - 1; i++ )
  {
    pdf = pdf * static_cast<double>(365 + 1 - i ) / 365.0;
  }
//
//  Compute the probability that person N has one of those N-1 birthdays.
//
  pdf = pdf * static_cast<double>(n - 1 ) / 365.0;

  return pdf;
}